

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int google::protobuf::internal::CalculateReserveSize<long,8>(int capacity,int new_size)

{
  LogMessage *pLVar1;
  int *piVar2;
  bool local_61;
  int local_60 [2];
  int doubled_size;
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  undefined4 local_20;
  undefined4 local_1c;
  int kSooCapacityElements;
  int kMaxSizeBeforeClamp;
  int lower_limit;
  int new_size_local;
  int capacity_local;
  
  kSooCapacityElements = 1;
  if (new_size < 1) {
    new_size_local = 1;
  }
  else {
    local_1c = 0x3ffffffb;
    kMaxSizeBeforeClamp = new_size;
    lower_limit = capacity;
    if (capacity < 0x3ffffffc) {
      local_20 = 1;
      local_49 = 0;
      local_61 = 0x7fffffff < (uint)capacity;
      if (local_61) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_48,"capacity == 0 || capacity >= lower_limit");
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
                   ,0x488,local_48._M_len,local_48._M_str);
        local_49 = 1;
        pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_38);
        pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,lower_limit);
        pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                           (pLVar1,(char (*) [2])0x221aeb);
        pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,1);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar1);
      }
      if ((local_49 & 1) != 0) {
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
      }
      local_60[0] = lower_limit * 2 + 1;
      piVar2 = std::max<int>(local_60,&kMaxSizeBeforeClamp);
      new_size_local = *piVar2;
    }
    else {
      new_size_local = std::numeric_limits<int>::max();
    }
  }
  return new_size_local;
}

Assistant:

inline int CalculateReserveSize(int capacity, int new_size) {
  constexpr int lower_limit =
      RepeatedFieldLowerClampLimit<T, kHeapRepHeaderSize>();
  if (new_size < lower_limit) {
    // Clamp to smallest allowed size.
    return lower_limit;
  }
  constexpr int kMaxSizeBeforeClamp =
      (std::numeric_limits<int>::max() - kHeapRepHeaderSize) / 2;
  if (PROTOBUF_PREDICT_FALSE(capacity > kMaxSizeBeforeClamp)) {
    return std::numeric_limits<int>::max();
  }
  constexpr int kSooCapacityElements = SooCapacityElements(sizeof(T));
  if (kSooCapacityElements > 0 && kSooCapacityElements < lower_limit) {
    // In this case, we need to set capacity to 0 here to ensure power-of-two
    // sized allocations.
    if (capacity < lower_limit) capacity = 0;
  } else {
    ABSL_DCHECK(capacity == 0 || capacity >= lower_limit)
        << capacity << " " << lower_limit;
  }
  // We want to double the number of bytes, not the number of elements, to try
  // to stay within power-of-two allocations.
  // The allocation has kHeapRepHeaderSize + sizeof(T) * capacity.
  int doubled_size = 2 * capacity + kHeapRepHeaderSize / sizeof(T);
  return std::max(doubled_size, new_size);
}